

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mpi_miller_rabin(mbedtls_mpi *X,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi W;
  mbedtls_mpi R;
  mbedtls_mpi A;
  mbedtls_mpi RR;
  mbedtls_mpi T;
  mbedtls_mpi _B;
  mbedtls_mpi_uint local_4e0;
  long local_4d8;
  size_t local_4d0;
  _func_int_void_ptr_uchar_ptr_size_t *local_4c8;
  void *local_4c0;
  mbedtls_mpi local_4b8;
  long local_4a0;
  mbedtls_mpi local_498;
  mbedtls_mpi local_480;
  mbedtls_mpi local_468;
  mbedtls_mpi local_450;
  mbedtls_mpi local_438 [43];
  
  local_4b8.s = 1;
  local_4b8.n = 0;
  local_4b8.p = (mbedtls_mpi_uint *)0x0;
  local_498.s = 1;
  local_498.n = 0;
  local_498.p = (mbedtls_mpi_uint *)0x0;
  local_450.s = 1;
  local_450.n = 0;
  local_450.p = (mbedtls_mpi_uint *)0x0;
  local_480.s = 1;
  local_480.n = 0;
  local_480.p = (ulong *)0x0;
  local_468.s = 1;
  local_468.n = 0;
  local_468.p = (mbedtls_mpi_uint *)0x0;
  local_4e0 = 1;
  local_438[0].s = 1;
  local_438[0].n = 1;
  local_438[0].p = &local_4e0;
  iVar1 = mbedtls_mpi_sub_mpi(&local_4b8,X,local_438);
  if (iVar1 == 0) {
    if (local_4b8.n == 0) {
      sVar2 = 0;
    }
    else {
      sVar2 = 0;
      lVar3 = 0;
      sVar4 = 0;
      do {
        uVar5 = 0;
        do {
          if ((local_4b8.p[sVar4] >> (uVar5 & 0x3f) & 1) != 0) {
            sVar2 = uVar5 - lVar3;
            goto LAB_00165e28;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != 0x40);
        sVar4 = sVar4 + 1;
        lVar3 = lVar3 + -0x40;
      } while (sVar4 != local_4b8.n);
    }
LAB_00165e28:
    iVar1 = mbedtls_mpi_copy(&local_498,&local_4b8);
    if ((iVar1 == 0) && (iVar1 = mbedtls_mpi_shift_r(&local_498,sVar2), iVar1 == 0)) {
      local_4d0 = sVar2;
      local_4c8 = f_rng;
      local_4c0 = p_rng;
      sVar2 = mbedtls_mpi_bitlen(X);
      local_4a0 = 2;
      if ((sVar2 < 0x514) &&
         ((((local_4a0 = 3, sVar2 < 0x352 && (local_4a0 = 4, sVar2 < 0x28a)) &&
           (local_4a0 = 8, sVar2 < 0x15e)) && (local_4a0 = 0xc, sVar2 < 0xfa)))) {
        local_4a0 = (ulong)(sVar2 < 0x96) * 9 + 0x12;
      }
      local_4d8 = 0;
      while( true ) {
        uVar5 = X->n << 3;
        iVar1 = -4;
        if ((uVar5 < 0x401) &&
           (iVar1 = (*local_4c8)(local_4c0,(uchar *)local_438,uVar5), iVar1 == 0)) {
          iVar1 = mbedtls_mpi_read_binary(&local_480,(uchar *)local_438,uVar5);
        }
        if (iVar1 != 0) break;
        iVar1 = mbedtls_mpi_cmp_mpi(&local_480,&local_4b8);
        if (-1 < iVar1) {
          sVar2 = mbedtls_mpi_bitlen(&local_480);
          sVar4 = mbedtls_mpi_bitlen(&local_4b8);
          iVar1 = mbedtls_mpi_shift_r(&local_480,(sVar2 - sVar4) + 1);
          if (iVar1 != 0) break;
        }
        *local_480.p = *local_480.p | 3;
        iVar6 = 0x1f;
        do {
          do {
            uVar5 = X->n << 3;
            iVar1 = -4;
            if ((uVar5 < 0x401) &&
               (iVar1 = (*local_4c8)(local_4c0,(uchar *)local_438,uVar5), iVar1 == 0)) {
              iVar1 = mbedtls_mpi_read_binary(&local_480,(uchar *)local_438,uVar5);
            }
            if (iVar1 != 0) goto LAB_00165e4f;
            sVar2 = mbedtls_mpi_bitlen(&local_480);
            sVar4 = mbedtls_mpi_bitlen(&local_4b8);
            if ((sVar4 <= sVar2 && sVar2 - sVar4 != 0) &&
               (iVar1 = mbedtls_mpi_shift_r(&local_480,sVar2 - sVar4), iVar1 != 0))
            goto LAB_00165e4f;
            bVar7 = iVar6 == 0;
            iVar6 = iVar6 + -1;
            if (bVar7) {
              return -0xe;
            }
            iVar1 = mbedtls_mpi_cmp_mpi(&local_480,&local_4b8);
          } while (-1 < iVar1);
          local_4e0 = 1;
          local_438[0].s = 1;
          local_438[0].n = 1;
          local_438[0].p = &local_4e0;
          iVar1 = mbedtls_mpi_cmp_mpi(&local_480,local_438);
        } while (iVar1 < 1);
        iVar1 = mbedtls_mpi_exp_mod(&local_480,&local_480,&local_498,X,&local_468);
        if (iVar1 != 0) break;
        iVar1 = mbedtls_mpi_cmp_mpi(&local_480,&local_4b8);
        if (iVar1 != 0) {
          local_4e0 = 1;
          local_438[0].s = 1;
          local_438[0].n = 1;
          local_438[0].p = &local_4e0;
          iVar1 = mbedtls_mpi_cmp_mpi(&local_480,local_438);
          if (iVar1 != 0) {
            if (1 < local_4d0) {
              uVar5 = 2;
              while (iVar1 = mbedtls_mpi_cmp_mpi(&local_480,&local_4b8), iVar1 != 0) {
                iVar1 = mbedtls_mpi_mul_mpi(&local_450,&local_480,&local_480);
                if ((iVar1 != 0) ||
                   (iVar1 = mbedtls_mpi_mod_mpi(&local_480,&local_450,X), iVar1 != 0))
                goto LAB_00165e4f;
                local_4e0 = 1;
                local_438[0].s = 1;
                local_438[0].n = 1;
                local_438[0].p = &local_4e0;
                iVar1 = mbedtls_mpi_cmp_mpi(&local_480,local_438);
                if ((iVar1 == 0) || (bVar7 = local_4d0 <= uVar5, uVar5 = uVar5 + 1, bVar7)) break;
              }
            }
            iVar6 = mbedtls_mpi_cmp_mpi(&local_480,&local_4b8);
            iVar1 = -0xe;
            if (iVar6 != 0) break;
            local_4e0 = 1;
            local_438[0].s = 1;
            local_438[0].n = 1;
            local_438[0].p = &local_4e0;
            iVar6 = mbedtls_mpi_cmp_mpi(&local_480,local_438);
            if (iVar6 == 0) break;
          }
        }
        local_4d8 = local_4d8 + 1;
        iVar1 = 0;
        if (local_4d8 == local_4a0) break;
      }
    }
  }
LAB_00165e4f:
  mbedtls_mpi_free(&local_4b8);
  mbedtls_mpi_free(&local_498);
  mbedtls_mpi_free(&local_450);
  mbedtls_mpi_free(&local_480);
  mbedtls_mpi_free(&local_468);
  return iVar1;
}

Assistant:

static int mpi_miller_rabin( const mbedtls_mpi *X,
                             int (*f_rng)(void *, unsigned char *, size_t),
                             void *p_rng )
{
    int ret, count;
    size_t i, j, k, n, s;
    mbedtls_mpi W, R, T, A, RR;

    mbedtls_mpi_init( &W ); mbedtls_mpi_init( &R ); mbedtls_mpi_init( &T ); mbedtls_mpi_init( &A );
    mbedtls_mpi_init( &RR );

    /*
     * W = |X| - 1
     * R = W >> lsb( W )
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_sub_int( &W, X, 1 ) );
    s = mbedtls_mpi_lsb( &W );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &R, &W ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &R, s ) );

    i = mbedtls_mpi_bitlen( X );
    /*
     * HAC, table 4.4
     */
    n = ( ( i >= 1300 ) ?  2 : ( i >=  850 ) ?  3 :
          ( i >=  650 ) ?  4 : ( i >=  350 ) ?  8 :
          ( i >=  250 ) ? 12 : ( i >=  150 ) ? 18 : 27 );

    for( i = 0; i < n; i++ )
    {
        /*
         * pick a random A, 1 < A < |X| - 1
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &A, X->n * ciL, f_rng, p_rng ) );

        if( mbedtls_mpi_cmp_mpi( &A, &W ) >= 0 )
        {
            j = mbedtls_mpi_bitlen( &A ) - mbedtls_mpi_bitlen( &W );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &A, j + 1 ) );
        }
        A.p[0] |= 3;

        count = 0;
        do {
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &A, X->n * ciL, f_rng, p_rng ) );

            j = mbedtls_mpi_bitlen( &A );
            k = mbedtls_mpi_bitlen( &W );
            if (j > k) {
                MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &A, j - k ) );
            }

            if (count++ > 30) {
                return MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
            }

        } while ( mbedtls_mpi_cmp_mpi( &A, &W ) >= 0 ||
                  mbedtls_mpi_cmp_int( &A, 1 )  <= 0    );

        /*
         * A = A^R mod |X|
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &A, &A, &R, X, &RR ) );

        if( mbedtls_mpi_cmp_mpi( &A, &W ) == 0 ||
            mbedtls_mpi_cmp_int( &A,  1 ) == 0 )
            continue;

        j = 1;
        while( j < s && mbedtls_mpi_cmp_mpi( &A, &W ) != 0 )
        {
            /*
             * A = A * A mod |X|
             */
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &T, &A, &A ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &A, &T, X  ) );

            if( mbedtls_mpi_cmp_int( &A, 1 ) == 0 )
                break;

            j++;
        }

        /*
         * not prime if A != |X| - 1 or A == 1
         */
        if( mbedtls_mpi_cmp_mpi( &A, &W ) != 0 ||
            mbedtls_mpi_cmp_int( &A,  1 ) == 0 )
        {
            ret = MBEDTLS_ERR_MPI_NOT_ACCEPTABLE;
            break;
        }
    }

cleanup:
    mbedtls_mpi_free( &W ); mbedtls_mpi_free( &R ); mbedtls_mpi_free( &T ); mbedtls_mpi_free( &A );
    mbedtls_mpi_free( &RR );

    return( ret );
}